

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeIsAlnum(unicode_tokenizer *p,int iCode)

{
  uint uVar1;
  uint uVar2;
  int iCode_local;
  unicode_tokenizer *p_local;
  
  uVar1 = sqlite3FtsUnicodeIsalnum(iCode);
  uVar2 = unicodeIsException(p,iCode);
  return uVar1 ^ uVar2;
}

Assistant:

static int unicodeIsAlnum(unicode_tokenizer *p, int iCode){
  assert( (sqlite3FtsUnicodeIsalnum(iCode) & 0xFFFFFFFE)==0 );
  return sqlite3FtsUnicodeIsalnum(iCode) ^ unicodeIsException(p, iCode);
}